

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

void at(tagval *args,int numargs)

{
  tagval *this;
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  int local_3c;
  char *pcStack_38;
  int pos;
  char *list;
  char *pcStack_28;
  int i;
  char *end;
  char *start;
  tagval *ptStack_10;
  int numargs_local;
  tagval *args_local;
  
  if (numargs != 0) {
    start._4_4_ = numargs;
    ptStack_10 = args;
    pcVar2 = tagval::getstr(args);
    end = pcVar2;
    sVar3 = strlen(pcVar2);
    pcStack_28 = pcVar2 + sVar3;
    for (list._4_4_ = 1; this = commandret, list._4_4_ < start._4_4_; list._4_4_ = list._4_4_ + 1) {
      pcStack_38 = end;
      local_3c = tagval::getint(ptStack_10 + list._4_4_);
      while ((0 < local_3c &&
             (bVar1 = parselist(&stack0xffffffffffffffc8,&liststart,&listend,&listquotestart,
                                &listquoteend), bVar1))) {
        local_3c = local_3c + -1;
      }
      if ((0 < local_3c) ||
         (bVar1 = parselist(&stack0xffffffffffffffc8,&end,&stack0xffffffffffffffd8,&listquotestart,
                            &listquoteend), !bVar1)) {
        pcStack_28 = "";
        end = "";
      }
    }
    pcVar2 = newstring(end,(long)pcStack_28 - (long)end);
    tagval::setstr(this,pcVar2);
  }
  return;
}

Assistant:

void at(tagval *args, int numargs)
{
    if(!numargs) return;
    const char *start = args[0].getstr(), *end = start + strlen(start);
    for(int i = 1; i < numargs; i++)
    {
        const char *list = start;
        int pos = args[i].getint();
        for(; pos > 0; pos--) if(!parselist(list)) break;
        if(pos > 0 || !parselist(list, start, end)) start = end = "";
    }
    commandret->setstr(newstring(start, end-start));
}